

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O2

CompilationOptions * __thiscall
slang::Bag::getOrDefault<slang::ast::CompilationOptions>
          (CompilationOptions *__return_storage_ptr__,Bag *this)

{
  CompilationOptions *pCVar1;
  
  pCVar1 = get<slang::ast::CompilationOptions>(this);
  if (pCVar1 == (CompilationOptions *)0x0) {
    memset(__return_storage_ptr__,0,0xa8);
    ast::CompilationOptions::CompilationOptions(__return_storage_ptr__);
  }
  else {
    ast::CompilationOptions::CompilationOptions(__return_storage_ptr__,pCVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T getOrDefault() const {
        const T* result = get<T>();
        if (result)
            return *result;
        return T();
    }